

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall (anonymous_namespace)::KeyConverter::ToString_abi_cxx11_(KeyConverter *this,Key *key)

{
  long lVar1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDI
  ;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  Span<const_unsigned_char> *in_stack_ffffffffffffff68;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  CPubKey *in_stack_ffffffffffffffb0;
  KeyConverter *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffe0 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  anon_unknown.dwarf_6f47f7::KeyConverter::ToPKBytes
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_stack_ffffffffffffff68,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  HexStr_abi_cxx11_((Span<const_unsigned_char>)in_stack_ffffffffffffffe0);
  this_00 = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xffffffffffffffd8;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this_00,in_stack_ffffffffffffff60);
  std::__cxx11::string::~string(in_stack_ffffffffffffff58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> ToString(const Key& key) const {
        return HexStr(ToPKBytes(key));
    }